

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall Hes_Apu::balance_changed(Hes_Apu *this,Hes_Osc *osc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int right;
  int left;
  int vol;
  Hes_Osc *osc_local;
  Hes_Apu *this_local;
  
  iVar3 = (osc->control & 0x1f) - 0x3c;
  left = iVar3 + ((int)(uint)osc->balance >> 3 & 0x1eU) + (this->balance >> 3 & 0x1eU);
  if (left < 0) {
    left = 0;
  }
  right = iVar3 + (osc->balance & 0xf) * 2 + (this->balance & 0xfU) * 2;
  if (right < 0) {
    right = 0;
  }
  sVar1 = balance_changed::log_table[left];
  sVar2 = balance_changed::log_table[right];
  osc->outputs[0] = osc->chans[0];
  osc->outputs[1] = (Blip_Buffer *)0x0;
  if ((int)sVar1 != (int)sVar2) {
    osc->outputs[0] = osc->chans[1];
    osc->outputs[1] = osc->chans[2];
  }
  osc->last_amp[0] = ((int)sVar1 - (int)osc->volume[0]) * 0x10 + osc->last_amp[0];
  osc->last_amp[1] = ((int)sVar2 - (int)osc->volume[1]) * 0x10 + osc->last_amp[1];
  osc->volume[0] = sVar1;
  osc->volume[1] = sVar2;
  return;
}

Assistant:

void Hes_Apu::balance_changed( Hes_Osc& osc )
{
	static short const log_table [32] = { // ~1.5 db per step
		#define ENTRY( factor ) short (factor * Hes_Osc::amp_range / 31.0 + 0.5)
		ENTRY( 0.000000 ),ENTRY( 0.005524 ),ENTRY( 0.006570 ),ENTRY( 0.007813 ),
		ENTRY( 0.009291 ),ENTRY( 0.011049 ),ENTRY( 0.013139 ),ENTRY( 0.015625 ),
		ENTRY( 0.018581 ),ENTRY( 0.022097 ),ENTRY( 0.026278 ),ENTRY( 0.031250 ),
		ENTRY( 0.037163 ),ENTRY( 0.044194 ),ENTRY( 0.052556 ),ENTRY( 0.062500 ),
		ENTRY( 0.074325 ),ENTRY( 0.088388 ),ENTRY( 0.105112 ),ENTRY( 0.125000 ),
		ENTRY( 0.148651 ),ENTRY( 0.176777 ),ENTRY( 0.210224 ),ENTRY( 0.250000 ),
		ENTRY( 0.297302 ),ENTRY( 0.353553 ),ENTRY( 0.420448 ),ENTRY( 0.500000 ),
		ENTRY( 0.594604 ),ENTRY( 0.707107 ),ENTRY( 0.840896 ),ENTRY( 1.000000 ),
		#undef ENTRY
	};
	
	int vol = (osc.control & 0x1F) - 0x1E * 2;
	
	int left  = vol + (osc.balance >> 3 & 0x1E) + (balance >> 3 & 0x1E);
	if ( left  < 0 ) left  = 0;
	
	int right = vol + (osc.balance << 1 & 0x1E) + (balance << 1 & 0x1E);
	if ( right < 0 ) right = 0;
	
	left  = log_table [left ];
	right = log_table [right];
	
	// optimizing for the common case of being centered also allows easy
	// panning using Effects_Buffer
	osc.outputs [0] = osc.chans [0]; // center
	osc.outputs [1] = 0;
	if ( left != right )
	{
		osc.outputs [0] = osc.chans [1]; // left
		osc.outputs [1] = osc.chans [2]; // right
	}
	
	if ( center_waves )
	{
		osc.last_amp [0] += (left  - osc.volume [0]) * 16;
		osc.last_amp [1] += (right - osc.volume [1]) * 16;
	}
	
	osc.volume [0] = left;
	osc.volume [1] = right;
}